

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
__thiscall
SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
operator>>(SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
           *this,SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 bits)

{
  if (bits.m_int < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x179f,
                  "SafeInt<T, E> SafeInt<unsigned short>::operator>>(SafeInt<U, E>) const [T = unsigned short, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = int]"
                 );
  }
  if ((uint)bits.m_int < 0x10) {
    return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            )(*(ushort *)this >> ((byte)bits.m_int & 0x1f));
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17a0,
                "SafeInt<T, E> SafeInt<unsigned short>::operator>>(SafeInt<U, E>) const [T = unsigned short, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = int]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator >>( SafeInt< U, E > bits ) const SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        return SafeInt< T, E >( (T)(m_int >> (U)bits) );
    }